

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubString.cpp
# Opt level: O1

char16 * __thiscall Js::SubString::GetSz(SubString *this)

{
  Recycler *recycler;
  charcount_t length;
  char16 *pcVar1;
  
  if ((this->originalFullStringReference).ptr != (void *)0x0) {
    recycler = ((((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->recycler
    ;
    pcVar1 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
    length = JavascriptString::GetLength(&this->super_JavascriptString);
    pcVar1 = JavascriptString::AllocateLeafAndCopySz(recycler,pcVar1,length);
    JavascriptString::SetBuffer(&this->super_JavascriptString,pcVar1);
    (this->originalFullStringReference).ptr = (void *)0x0;
  }
  pcVar1 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
  return pcVar1;
}

Assistant:

const char16* SubString::GetSz()
    {
        if (originalFullStringReference)
        {
            Recycler* recycler = this->GetScriptContext()->GetRecycler();
            char16 * newInstance = AllocateLeafAndCopySz(recycler, UnsafeGetBuffer(), GetLength());
            this->SetBuffer(newInstance);

            // We don't need the string reference anymore, set it to nullptr and use this to know our string is nullptr terminated
            originalFullStringReference = nullptr;
        }

        return UnsafeGetBuffer();
    }